

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPathSeparator.h
# Opt level: O1

void __thiscall
HighsPathSeparator::HighsPathSeparator(HighsPathSeparator *this,HighsMipSolver *mipsolver)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  HighsSeparator::HighsSeparator(&this->super_HighsSeparator,mipsolver,"PathAggr sepa");
  (this->super_HighsSeparator)._vptr_HighsSeparator = (_func_int **)&PTR_separateLpSolution_00449068
  ;
  (this->randgen).state = 0x9eefcacfa6167af6;
  uVar2 = (ulong)(uint)(mipsolver->options_mip_->super_HighsOptionsStruct).random_seed;
  (this->randgen).state = uVar2;
  lVar1 = uVar2 + 0x8a183895eeac1536;
  do {
    uVar3 = ((uVar2 & 0xffffffff) + 0xc8497d2a400d9551) * ((uVar2 >> 0x20) + 0x80c8963be3e4c2f3);
    uVar4 = ((uVar3 >> 0x20) + 0x42d8680e260ae5b) * lVar1 >> 0x20;
    uVar2 = uVar4 ^ uVar3;
  } while (uVar3 - uVar4 == 0);
  (this->randgen).state = uVar2;
  return;
}

Assistant:

HighsPathSeparator(const HighsMipSolver& mipsolver)
      : HighsSeparator(mipsolver, "PathAggr sepa") {
    randgen.initialise(mipsolver.options_mip_->random_seed);
  }